

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O3

ButtonRole __thiscall
QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
::take(QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
       *this,QAbstractButton **key)

{
  ButtonRole BVar1;
  iterator it;
  const_iterator cVar2;
  
  cVar2 = find(this,key);
  it.i = cVar2.i;
  BVar1 = AcceptRole;
  if ((this->c).keys.super_QVLABase<QAbstractButton_*>.super_QVLABaseBase.s != it.i) {
    BVar1 = *(ButtonRole *)
             ((long)(this->c).values.super_QVLABase<QDialogButtonBox::ButtonRole>.super_QVLABaseBase
                    .ptr + it.i * 4);
    it.c = &this->c;
    erase(this,it);
  }
  return BVar1;
}

Assistant:

T take(const Key &key)
    {
        return do_take(find(key));
    }